

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer_type.cpp
# Opt level: O2

string * __thiscall
duckdb::OptimizerTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,OptimizerType type)

{
  long lVar1;
  InternalException *this_00;
  long lVar2;
  allocator local_39;
  string local_38;
  
  lVar1 = -0x10;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 0x1b0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_38,"Invalid optimizer type",&local_39);
      InternalException::InternalException(this_00,&local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar1 = lVar2 + 0x10;
  } while (*(int *)((long)&DAT_027a4228 + lVar2) != (int)this);
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             *(char **)((long)&PTR_anon_var_dwarf_1922850_027a4220 + lVar2),(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string OptimizerTypeToString(OptimizerType type) {
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		if (internal_optimizer_types[i].type == type) {
			return internal_optimizer_types[i].name;
		}
	}
	throw InternalException("Invalid optimizer type");
}